

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ConsumeIdentifier(Parser *this,string *output,char *error)

{
  TokenType TVar1;
  allocator local_39;
  string local_38;
  
  TVar1 = (this->input_->current_).type;
  if (TVar1 == TYPE_IDENTIFIER) {
    std::__cxx11::string::_M_assign((string *)output);
    io::Tokenizer::Next(this->input_);
  }
  else {
    std::__cxx11::string::string((string *)&local_38,error,&local_39);
    AddError(this,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return TVar1 == TYPE_IDENTIFIER;
}

Assistant:

bool Parser::ConsumeIdentifier(string* output, const char* error) {
  if (LookingAtType(io::Tokenizer::TYPE_IDENTIFIER)) {
    *output = input_->current().text;
    input_->Next();
    return true;
  } else {
    AddError(error);
    return false;
  }
}